

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GenerateHeaderSetVerificationFile
          (string *__return_storage_ptr__,cmGeneratorTarget *this,cmSourceFile *source,string *dir,
          optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *languages)

{
  pointer pAVar1;
  bool bVar2;
  string *psVar3;
  vector<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  *pvVar4;
  size_type sVar5;
  cmSourceFile *this_00;
  ostream *poVar6;
  pointer pAVar7;
  string headerFilename;
  string language;
  cmAlphaNum local_2e8;
  string extension;
  cmGeneratedFileStream fout;
  
  extension._M_dataplus._M_p = (pointer)&extension.field_2;
  extension._M_string_length = 0;
  extension.field_2._M_local_buf[0] = '\0';
  psVar3 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  std::__cxx11::string::string((string *)&language,(string *)psVar3);
  if (language._M_string_length == 0) {
    if ((languages->
        super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_engaged == false) {
      std::
      optional<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::emplace<>(languages);
      pvVar4 = GetAllConfigSources(this);
      pAVar1 = (pvVar4->
               super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pAVar7 = (pvVar4->
                    super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
                    )._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar1;
          pAVar7 = pAVar7 + 1) {
        psVar3 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(pAVar7->Source);
        bVar2 = std::operator==(psVar3,"CXX");
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fout,"CXX",(allocator<char> *)&local_2e8);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)languages,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
          std::__cxx11::string::~string((string *)&fout);
          break;
        }
        bVar2 = std::operator==(psVar3,"C");
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&fout,"C",(allocator<char> *)&local_2e8);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)languages,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout);
          std::__cxx11::string::~string((string *)&fout);
        }
      }
      if (*(long *)((long)&(languages->
                           super__Optional_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ._M_payload + 0x28) == 0) {
        fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)0x0;
        fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
        fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
        cmGlobalGenerator::GetEnabledLanguages
                  (this->GlobalGenerator,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&fout);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)languages,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fout);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fout,"CXX",(allocator<char> *)&local_2e8);
    sVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)languages,(key_type *)&fout);
    std::__cxx11::string::~string((string *)&fout);
    if (sVar5 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fout,"C",(allocator<char> *)&local_2e8);
      sVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)languages,(key_type *)&fout);
      std::__cxx11::string::~string((string *)&fout);
      if (sVar5 == 0) goto LAB_00354512;
    }
    std::__cxx11::string::assign((char *)&language);
  }
LAB_00354512:
  bVar2 = std::operator==(&language,"C");
  if ((bVar2) || (bVar2 = std::operator==(&language,"CXX"), bVar2)) {
    std::__cxx11::string::assign((char *)&extension);
    std::__cxx11::string::string((string *)&headerFilename,(string *)dir);
    if (headerFilename._M_string_length != 0) {
      std::__cxx11::string::push_back((char)&headerFilename);
    }
    cmSourceFile::GetLocation(source);
    std::__cxx11::string::append((string *)&headerFilename);
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
         (psVar3->_M_dataplus)._M_p;
    fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)psVar3->_M_string_length;
    local_2e8.View_._M_str = local_2e8.Digits_;
    local_2e8.View_._M_len = 1;
    local_2e8.Digits_[0] = '/';
    psVar3 = GetName_abi_cxx11_(this);
    cmStrCat<std::__cxx11::string,char[31],std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,(cmAlphaNum *)&fout,&local_2e8,psVar3,
               (char (*) [31])"_verify_interface_header_sets/",&headerFilename,&extension);
    this_00 = cmMakefile::GetOrCreateSource(this->Makefile,__return_storage_ptr__,false,Ambiguous);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fout,"LANGUAGE",(allocator<char> *)&local_2e8);
    cmSourceFile::SetProperty(this_00,(string *)&fout,&language);
    std::__cxx11::string::~string((string *)&fout);
    cmsys::SystemTools::GetFilenamePath((string *)&fout,__return_storage_ptr__);
    cmsys::SystemTools::MakeDirectory((string *)&fout,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)&fout);
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,__return_storage_ptr__,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
    poVar6 = std::operator<<((ostream *)&fout,"#include <");
    poVar6 = std::operator<<(poVar6,(string *)&headerFilename);
    std::operator<<(poVar6,"> // IWYU pragma: associated\n");
    std::ofstream::close();
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
    std::__cxx11::string::~string((string *)&headerFilename);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&fout);
  }
  std::__cxx11::string::~string((string *)&language);
  std::__cxx11::string::~string((string *)&extension);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GenerateHeaderSetVerificationFile(
  cmSourceFile& source, const std::string& dir,
  cm::optional<std::set<std::string>>& languages) const
{
  std::string extension;
  std::string language = source.GetOrDetermineLanguage();

  if (language.empty()) {
    if (!languages) {
      languages.emplace();
      for (auto const& tgtSource : this->GetAllConfigSources()) {
        auto const& tgtSourceLanguage =
          tgtSource.Source->GetOrDetermineLanguage();
        if (tgtSourceLanguage == "CXX") {
          languages->insert("CXX");
          break; // C++ overrides everything else, so we don't need to keep
                 // checking.
        }
        if (tgtSourceLanguage == "C") {
          languages->insert("C");
        }
      }

      if (languages->empty()) {
        std::vector<std::string> languagesVector;
        this->GlobalGenerator->GetEnabledLanguages(languagesVector);
        languages->insert(languagesVector.begin(), languagesVector.end());
      }
    }

    if (languages->count("CXX")) {
      language = "CXX";
    } else if (languages->count("C")) {
      language = "C";
    }
  }

  if (language == "C") {
    extension = ".c";
  } else if (language == "CXX") {
    extension = ".cxx";
  } else {
    return "";
  }

  std::string headerFilename = dir;
  if (!headerFilename.empty()) {
    headerFilename += '/';
  }
  headerFilename += source.GetLocation().GetName();

  auto filename = cmStrCat(
    this->LocalGenerator->GetCurrentBinaryDirectory(), '/', this->GetName(),
    "_verify_interface_header_sets/", headerFilename, extension);
  auto* verificationSource = this->Makefile->GetOrCreateSource(filename);
  verificationSource->SetProperty("LANGUAGE", language);

  cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(filename));

  cmGeneratedFileStream fout(filename);
  fout.SetCopyIfDifferent(true);
  // IWYU pragma: associated allows include what you use to
  // consider the headerFile as part of the entire language
  // unit within include-what-you-use and as a result allows
  // one to get IWYU advice for headers :)
  fout << "#include <" << headerFilename << "> // IWYU pragma: associated\n";
  fout.close();

  return filename;
}